

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O1

void just::temp::directory::delete_dir(string *path_)

{
  __nlink_t *p_Var1;
  int iVar2;
  long *plVar3;
  __nlink_t *p_Var4;
  size_type *psVar5;
  string fp;
  string e;
  dir_t d;
  stat buf;
  string local_138;
  undefined2 *local_118;
  undefined8 local_110;
  undefined2 local_108;
  undefined6 uStack_106;
  string local_f8;
  dir_t local_d8;
  stat local_c0;
  
  local_d8._d = (handle_t)opendir((path_->_M_dataplus)._M_p);
  local_d8._eod = local_d8._d == (handle_t)0x0;
  dir_t::next_file_abi_cxx11_(&local_f8,&local_d8);
  if (local_d8._eod == false) {
    p_Var1 = &local_c0.st_nlink;
    do {
      local_108 = 0x2f;
      local_110 = 1;
      local_118 = &local_108;
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_118,0,(char *)0x0,(ulong)(path_->_M_dataplus)._M_p);
      p_Var4 = (__nlink_t *)(plVar3 + 2);
      if ((__nlink_t *)*plVar3 == p_Var4) {
        local_c0.st_nlink = *p_Var4;
        local_c0._24_8_ = plVar3[3];
        local_c0.st_dev = (__dev_t)p_Var1;
      }
      else {
        local_c0.st_nlink = *p_Var4;
        local_c0.st_dev = (__dev_t)*plVar3;
      }
      local_c0.st_ino = plVar3[1];
      *plVar3 = (long)p_Var4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)local_f8._M_dataplus._M_p);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_138.field_2._M_allocated_capacity = *psVar5;
        local_138.field_2._8_8_ = plVar3[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar5;
        local_138._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_138._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((__nlink_t *)local_c0.st_dev != p_Var1) {
        operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,CONCAT62(uStack_106,local_108) + 1);
      }
      iVar2 = stat(local_138._M_dataplus._M_p,&local_c0);
      if ((iVar2 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
        delete_dir(&local_138);
      }
      else {
        delete_file(&local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      dir_t::next_file_abi_cxx11_((string *)&local_c0,&local_d8);
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_c0);
      if ((__nlink_t *)local_c0.st_dev != p_Var1) {
        operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
      }
    } while (local_d8._eod == false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._d != (handle_t)0x0) {
    closedir((DIR *)local_d8._d);
  }
  delete_empty_dir(path_);
  return;
}

Assistant:

static void delete_dir(const std::string& path_)
      {
        {
          dir_t d(path_);
          for (std::string e = d.next_file(); !d.eod(); e = d.next_file())
          {
            const std::string fp = path_ + path_separator() + e;
            if (is_directory(fp))
            {
              delete_dir(fp);
            }
            else
            {
              delete_file(fp);
            }
          }
        }
        delete_empty_dir(path_);
      }